

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O1

bool woff2::FixChecksums(Font *font)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  pointer puVar3;
  ushort uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Table *pTVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  Table *pTVar11;
  int iVar12;
  uint uVar13;
  _Base_ptr this;
  
  pTVar8 = Font::FindTable(font,0x68656164);
  if (pTVar8 == (Table *)0x0) {
    bVar5 = false;
  }
  else {
    pTVar11 = pTVar8->reuse_of;
    if (pTVar8->reuse_of == (Table *)0x0) {
      pTVar11 = pTVar8;
    }
    bVar5 = false;
    iVar12 = 0;
    if (0xb < pTVar11->length) {
      puVar3 = (pTVar11->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3[8] = '\0';
      puVar3[9] = '\0';
      puVar3[10] = '\0';
      puVar3[0xb] = '\0';
      p_Var9 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        iVar12 = 0;
        do {
          this = (_Base_ptr)&p_Var9[1]._M_parent;
          bVar5 = Font::Table::IsReused((Table *)this);
          if (bVar5) {
            this = p_Var9[2]._M_right;
          }
          iVar6 = woff2::ComputeULongSum
                            ((uchar *)this->_M_left,(ulong)*(uint *)((long)&this->_M_parent + 4));
          *(int *)&this->field_0x4 = iVar6;
          iVar12 = iVar12 + iVar6;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      uVar2 = font->num_tables;
      uVar4 = 0xf;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar7 = (uint)uVar4;
      if (uVar2 == 0) {
        uVar7 = 0;
      }
      uVar13 = 0;
      if ((short)uVar7 != 0) {
        uVar13 = 0x10 << ((byte)uVar7 & 0x1f) & 0xffff;
      }
      iVar6 = (uVar7 + uVar2) * 0x10000 + font->flavor + uVar13 +
              ((uint)uVar2 * 0x10 - uVar13 & 0xffff);
      for (p_Var10 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != p_Var1;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        p_Var9 = (_Base_ptr)&p_Var10[1]._M_parent;
        bVar5 = Font::Table::IsReused((Table *)p_Var9);
        if (bVar5) {
          p_Var9 = p_Var10[2]._M_right;
        }
        iVar6 = iVar6 + p_Var9->_M_color + *(int *)&p_Var9->field_0x4 + *(int *)&p_Var9->_M_parent +
                *(int *)((long)&p_Var9->_M_parent + 4);
      }
      uVar7 = 0xb1b0afba - (iVar12 + iVar6);
      *(uint *)(puVar3 + 8) =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool FixChecksums(Font* font) {
  Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (head_table->reuse_of != NULL) {
    head_table = head_table->reuse_of;
  }
  if (head_table->length < 12) {
    return FONT_COMPRESSION_FAILURE();
  }

  uint8_t* head_buf = &head_table->buffer[0];
  size_t offset = 8;
  StoreU32(0, &offset, head_buf);
  uint32_t file_checksum = 0;
  uint32_t head_checksum = 0;
  for (auto& i : font->tables) {
    Font::Table* table = &i.second;
    if (table->IsReused()) {
      table = table->reuse_of;
    }
    table->checksum = ComputeULongSum(table->data, table->length);
    file_checksum += table->checksum;

    if (table->tag == kHeadTableTag) {
      head_checksum = table->checksum;
    }
  }

  file_checksum += ComputeHeaderChecksum(*font);
  offset = 8;
  StoreU32(0xb1b0afba - file_checksum, &offset, head_buf);

  return true;
}